

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O1

void __thiscall WorldSolver::WorldSolver(WorldSolver *this,RandomizerWorld *world)

{
  _Rb_tree_header *p_Var1;
  
  this->_world = world;
  p_Var1 = &(this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header;
  (this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->_start_node = (WorldNode *)0x0;
  this->_end_node = (WorldNode *)0x0;
  (this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_debug_log).m_type = null;
  (this->_debug_log).m_value.object = (object_t *)0x0;
  memset(&(this->_forbidden_items)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xe4);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->_debug_log,true);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->_debug_log,true);
  return;
}

Assistant:

WorldSolver::WorldSolver(const RandomizerWorld& world) : _world (world)
{}